

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_hlsl.cpp
# Opt level: O0

void __thiscall
spirv_cross::CompilerHLSL::emit_interface_block_member_in_struct
          (CompilerHLSL *this,SPIRVariable *var,uint32_t member_index,uint32_t location,
          unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
          *active_locations)

{
  __node_base_ptr p_Var1;
  bool bVar2;
  uint32_t uVar3;
  SPIRType *pSVar4;
  TypedID *this_00;
  Bitset *pBVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts_2;
  value_type local_2dc;
  uint local_2d8;
  uint local_2d4;
  uint32_t i;
  uint32_t consumed_locations;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_290;
  uint32_t local_270;
  uint32_t local_26c;
  undefined1 local_268 [8];
  Bitset member_decorations;
  SPIRType *mbr_type;
  spirv_cross local_200 [32];
  undefined1 local_1e0 [8];
  string mbr_name;
  undefined1 local_1b0 [8];
  string semantic;
  SPIRType type;
  SPIREntryPoint *execution;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  *active_locations_local;
  uint32_t location_local;
  uint32_t member_index_local;
  SPIRVariable *var_local;
  CompilerHLSL *this_local;
  
  type.member_name_cache._M_h._M_single_bucket =
       (__node_base_ptr)Compiler::get_entry_point((Compiler *)this);
  uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(var->super_IVariant).field_0xc);
  pSVar4 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,uVar3);
  SPIRType::SPIRType((SPIRType *)((long)&semantic.field_2 + 8),pSVar4);
  ts_2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(ulong)var->storage;
  to_semantic_abi_cxx11_
            ((string *)local_1b0,this,location,
             *(ExecutionModel *)&type.member_name_cache._M_h._M_single_bucket[0x1d]._M_nxt,
             var->storage);
  uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&type);
  (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])(local_200,this,(ulong)uVar3,1);
  CompilerGLSL::to_member_name_abi_cxx11_
            ((string *)&mbr_type,&this->super_CompilerGLSL,(SPIRType *)((long)&semantic.field_2 + 8)
             ,member_index);
  join<std::__cxx11::string,char_const(&)[2],std::__cxx11::string>
            ((string *)local_1e0,local_200,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x597e50,
             (char (*) [2])&mbr_type,ts_2);
  ::std::__cxx11::string::~string((string *)&mbr_type);
  ::std::__cxx11::string::~string((string *)local_200);
  this_00 = (TypedID *)
            VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>::operator[]
                      ((VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_> *)&type.storage,
                       (ulong)member_index);
  uVar3 = TypedID::operator_cast_to_unsigned_int(this_00);
  member_decorations.higher._M_h._M_single_bucket =
       (__node_base_ptr)Compiler::get<spirv_cross::SPIRType>((Compiler *)this,uVar3);
  local_26c = (uint32_t)TypedID::operator_cast_to_TypedID((TypedID *)&type);
  pBVar5 = Compiler::get_member_decoration_bitset((Compiler *)this,(TypeID)local_26c,member_index);
  Bitset::Bitset((Bitset *)local_268,pBVar5);
  local_270 = (var->super_IVariant).self.id;
  bVar2 = Compiler::has_decoration((Compiler *)this,(ID)local_270,DecorationPerVertexKHR);
  if (bVar2) {
    Bitset::set((Bitset *)local_268,0x14a5);
  }
  (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x36])(&local_290,this,local_268);
  (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
            (&local_2b0,this,member_decorations.higher._M_h._M_single_bucket,0);
  p_Var1 = member_decorations.higher._M_h._M_single_bucket;
  uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(var->super_IVariant).self);
  (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x27])(&i,this,p_Var1,(ulong)uVar3);
  CompilerGLSL::
  statement<std::__cxx11::string,std::__cxx11::string,char_const(&)[2],std::__cxx11::string&,std::__cxx11::string,char_const(&)[4],std::__cxx11::string&,char_const(&)[2]>
            (&this->super_CompilerGLSL,&local_290,&local_2b0,(char (*) [2])0x57fa85,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1e0,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&i,
             (char (*) [4])0x5c0d87,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b0,
             (char (*) [2])0x5abb6c);
  ::std::__cxx11::string::~string((string *)&i);
  ::std::__cxx11::string::~string((string *)&local_2b0);
  ::std::__cxx11::string::~string((string *)&local_290);
  local_2d4 = type_to_consumed_locations
                        (this,(SPIRType *)member_decorations.higher._M_h._M_single_bucket);
  for (local_2d8 = 0; local_2d8 < local_2d4; local_2d8 = local_2d8 + 1) {
    local_2dc = location + local_2d8;
    ::std::
    unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
    ::insert(active_locations,&local_2dc);
  }
  Bitset::~Bitset((Bitset *)local_268);
  ::std::__cxx11::string::~string((string *)local_1e0);
  ::std::__cxx11::string::~string((string *)local_1b0);
  SPIRType::~SPIRType((SPIRType *)((long)&semantic.field_2 + 8));
  return;
}

Assistant:

void CompilerHLSL::emit_interface_block_member_in_struct(const SPIRVariable &var, uint32_t member_index,
                                                         uint32_t location,
                                                         std::unordered_set<uint32_t> &active_locations)
{
	auto &execution = get_entry_point();
	auto type = get<SPIRType>(var.basetype);
	auto semantic = to_semantic(location, execution.model, var.storage);
	auto mbr_name = join(to_name(type.self), "_", to_member_name(type, member_index));
	auto &mbr_type = get<SPIRType>(type.member_types[member_index]);

	Bitset member_decorations = get_member_decoration_bitset(type.self, member_index);
	if (has_decoration(var.self, DecorationPerVertexKHR))
		member_decorations.set(DecorationPerVertexKHR);

	statement(to_interpolation_qualifiers(member_decorations),
	          type_to_glsl(mbr_type),
	          " ", mbr_name, type_to_array_glsl(mbr_type, var.self),
	          " : ", semantic, ";");

	// Structs and arrays should consume more locations.
	uint32_t consumed_locations = type_to_consumed_locations(mbr_type);
	for (uint32_t i = 0; i < consumed_locations; i++)
		active_locations.insert(location + i);
}